

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBaseDebugState::~cmFindBaseDebugState(cmFindBaseDebugState *this)

{
  cmFindBase *pcVar1;
  pointer pDVar2;
  size_type sVar3;
  string_view sep;
  DebugLibState *state;
  pointer args;
  string_view prefix;
  string_view suffix;
  string path;
  bool local_eb;
  bool local_ea;
  bool local_e9;
  cmAlphaNum local_e8;
  string buffer;
  cmAlphaNum local_98;
  cmFindBaseDebugState *local_68;
  undefined8 local_60;
  char *pcStack_58;
  string local_50;
  
  if ((this->FindCommand->super_cmFindCommon).DebugMode == true) {
    local_e8.View_._M_str = (this->CommandName)._M_dataplus._M_p;
    local_e8.View_._M_len = (this->CommandName)._M_string_length;
    local_98.View_._M_len = 0x25;
    local_98.View_._M_str = " called with the following settings:\n";
    cmStrCat<>(&buffer,&local_e8,&local_98);
    local_e8.View_._M_len = 7;
    local_e8.View_._M_str = "  VAR: ";
    local_98.View_._M_str = (this->FindCommand->VariableName)._M_dataplus._M_p;
    local_98.View_._M_len = (this->FindCommand->VariableName)._M_string_length;
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    local_e8.View_._M_len = 9;
    local_e8.View_._M_str = "  NAMES: ";
    local_60 = 10;
    pcStack_58 = "\n         ";
    sep._M_str = "\n         ";
    sep._M_len = 10;
    prefix._M_str = "\"";
    prefix._M_len = 1;
    suffix._M_str = "\"";
    suffix._M_len = 1;
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_50,prefix,&this->FindCommand->Names,suffix,sep);
    local_98.View_._M_len = local_50._M_string_length;
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&local_50);
    local_e8.View_._M_len = 0x11;
    local_e8.View_._M_str = "  Documentation: ";
    local_98.View_._M_str = (this->FindCommand->VariableDocumentation)._M_dataplus._M_p;
    local_98.View_._M_len = (this->FindCommand->VariableDocumentation)._M_string_length;
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::append((char *)&buffer);
    local_e8.View_._M_len = 0x1c;
    local_e8.View_._M_str = "    Only Search Frameworks: ";
    cmAlphaNum::cmAlphaNum
              (&local_98,(uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkOnly);
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    local_e8.View_._M_len = 0x1c;
    local_e8.View_._M_str = "    Search Frameworks Last: ";
    cmAlphaNum::cmAlphaNum
              (&local_98,(uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkLast);
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    local_e8.View_._M_len = 0x1d;
    local_e8.View_._M_str = "    Search Frameworks First: ";
    cmAlphaNum::cmAlphaNum
              (&local_98,(uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkFirst);
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::append((char *)&buffer);
    local_e8.View_._M_len = 0x1b;
    local_e8.View_._M_str = "    Only Search AppBundle: ";
    cmAlphaNum::cmAlphaNum
              (&local_98,(uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleOnly);
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    local_e8.View_._M_len = 0x1b;
    local_e8.View_._M_str = "    Search AppBundle Last: ";
    cmAlphaNum::cmAlphaNum
              (&local_98,(uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleLast);
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    local_e8.View_._M_len = 0x1c;
    local_e8.View_._M_str = "    Search AppBundle First: ";
    cmAlphaNum::cmAlphaNum
              (&local_98,(uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleFirst);
    cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    if ((this->FindCommand->super_cmFindCommon).NoDefaultPath == true) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      local_e8.View_._M_len = 0x1d;
      local_e8.View_._M_str = "  CMAKE_FIND_USE_CMAKE_PATH: ";
      cmAlphaNum::cmAlphaNum(&local_98,(this->FindCommand->super_cmFindCommon).NoCMakePath ^ 1);
      pcVar1 = this->FindCommand;
      local_50._M_dataplus._M_p._0_1_ = (pcVar1->super_cmFindCommon).NoCMakeEnvironmentPath ^ 1;
      local_e9 = (bool)((pcVar1->super_cmFindCommon).NoSystemEnvironmentPath ^ 1);
      local_ea = (bool)((pcVar1->super_cmFindCommon).NoCMakeSystemPath ^ 1);
      local_eb = (bool)((pcVar1->super_cmFindCommon).NoCMakeInstallPath ^ 1);
      cmStrCat<char[2],char[42],bool,char[2],char[43],bool,char[2],char[37],bool,char[2],char[34],bool,char[2]>
                (&path,&local_e8,&local_98,(char (*) [2])0x5e8079,
                 (char (*) [42])"  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",(bool *)&local_50,
                 (char (*) [2])0x5e8079,(char (*) [43])"  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
                 &local_e9,(char (*) [2])0x5e8079,
                 (char (*) [37])"  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",&local_ea,
                 (char (*) [2])0x5e8079,(char (*) [34])"  CMAKE_FIND_USE_INSTALL_PREFIX: ",&local_eb
                 ,(char (*) [2])0x5e8079);
      std::__cxx11::string::append((string *)&buffer);
      std::__cxx11::string::~string((string *)&path);
    }
    local_e8.View_._M_str = (this->CommandName)._M_dataplus._M_p;
    local_e8.View_._M_len = (this->CommandName)._M_string_length;
    local_98.View_._M_len = 0x25;
    local_98.View_._M_str = " considered the following locations:\n";
    cmStrCat<>(&path,&local_e8,&local_98);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    pDVar2 = (this->FailedSearchLocations).
             super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_68 = this;
    for (args = (this->FailedSearchLocations).
                super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
                ._M_impl.super__Vector_impl_data._M_start; this = local_68, args != pDVar2;
        args = args + 1) {
      local_e8.View_._M_len = 2;
      local_e8.View_._M_str = "  ";
      local_98.View_._M_str = (args->path)._M_dataplus._M_p;
      local_98.View_._M_len = (args->path)._M_string_length;
      cmStrCat<>(&path,&local_e8,&local_98);
      if ((args->regexName)._M_string_length != 0) {
        local_e8.View_._M_len = path._M_string_length;
        local_e8.View_._M_str = path._M_dataplus._M_p;
        local_98.View_._M_len = 1;
        local_98.View_._M_str = "/";
        cmStrCat<std::__cxx11::string>(&local_50,&local_e8,&local_98,&args->regexName);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      local_e8.View_._M_len = path._M_string_length;
      local_e8.View_._M_str = path._M_dataplus._M_p;
      local_98.View_._M_len = 1;
      local_98.View_._M_str = "\n";
      cmStrCat<>(&local_50,&local_e8,&local_98);
      std::__cxx11::string::append((string *)&buffer);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&path);
    }
    sVar3 = (local_68->FoundSearchLocation).path._M_string_length;
    if (sVar3 == 0) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      local_e8.View_._M_len = 0x18;
      local_e8.View_._M_str = "The item was found at\n  ";
      local_98.View_._M_str = (local_68->FoundSearchLocation).path._M_dataplus._M_p;
      local_98.View_._M_len = sVar3;
      cmStrCat<char[2]>(&path,&local_e8,&local_98,(char (*) [2])0x5e8079);
      std::__cxx11::string::append((string *)&buffer);
      std::__cxx11::string::~string((string *)&path);
    }
    cmFindCommon::DebugMessage(&this->FindCommand->super_cmFindCommon,&buffer);
    std::__cxx11::string::~string((string *)&buffer);
  }
  DebugLibState::~DebugLibState(&this->FoundSearchLocation);
  std::
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ::~vector(&this->FailedSearchLocations);
  std::__cxx11::string::~string((string *)&this->CommandName);
  return;
}

Assistant:

cmFindBaseDebugState::~cmFindBaseDebugState()
{
  if (this->FindCommand->DebugMode) {
    std::string buffer =
      cmStrCat(this->CommandName, " called with the following settings:\n");
    buffer += cmStrCat("  VAR: ", this->FindCommand->VariableName, "\n");
    buffer += cmStrCat(
      "  NAMES: ", cmWrap("\"", this->FindCommand->Names, "\"", "\n         "),
      "\n");
    buffer += cmStrCat(
      "  Documentation: ", this->FindCommand->VariableDocumentation, "\n");
    buffer += "  Framework\n";
    buffer += cmStrCat("    Only Search Frameworks: ",
                       this->FindCommand->SearchFrameworkOnly, "\n");

    buffer += cmStrCat("    Search Frameworks Last: ",
                       this->FindCommand->SearchFrameworkLast, "\n");
    buffer += cmStrCat("    Search Frameworks First: ",
                       this->FindCommand->SearchFrameworkFirst, "\n");
    buffer += "  AppBundle\n";
    buffer += cmStrCat("    Only Search AppBundle: ",
                       this->FindCommand->SearchAppBundleOnly, "\n");
    buffer += cmStrCat("    Search AppBundle Last: ",
                       this->FindCommand->SearchAppBundleLast, "\n");
    buffer += cmStrCat("    Search AppBundle First: ",
                       this->FindCommand->SearchAppBundleFirst, "\n");

    if (this->FindCommand->NoDefaultPath) {
      buffer += "  NO_DEFAULT_PATH Enabled\n";
    } else {
      buffer += cmStrCat(
        "  CMAKE_FIND_USE_CMAKE_PATH: ", !this->FindCommand->NoCMakePath, "\n",
        "  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoCMakeEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoSystemEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
        !this->FindCommand->NoCMakeSystemPath, "\n",
        "  CMAKE_FIND_USE_INSTALL_PREFIX: ",
        !this->FindCommand->NoCMakeInstallPath, "\n");
    }

    buffer +=
      cmStrCat(this->CommandName, " considered the following locations:\n");
    for (auto const& state : this->FailedSearchLocations) {
      std::string path = cmStrCat("  ", state.path);
      if (!state.regexName.empty()) {
        path = cmStrCat(path, "/", state.regexName);
      }
      buffer += cmStrCat(path, "\n");
    }

    if (!this->FoundSearchLocation.path.empty()) {
      buffer += cmStrCat("The item was found at\n  ",
                         this->FoundSearchLocation.path, "\n");
    } else {
      buffer += "The item was not found.\n";
    }

    this->FindCommand->DebugMessage(buffer);
  }
}